

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall
ktx::ValidationContext::validateKTXcubemapIncomplete
          (ValidationContext *this,uint8_t *data,uint32_t size)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t value;
  int popCount;
  byte local_19;
  uint local_18;
  uint32_t local_14;
  
  this->foundKTXcubemapIncomplete = true;
  local_14 = size;
  if (size != 1) {
    error<unsigned_int&>(this,&Metadata::KTXcubemapIncompleteInvalidSize,&local_14);
  }
  if (local_14 != 0) {
    local_19 = *data;
    if (0x3f < local_19) {
      error<unsigned_char&>(this,&Metadata::KTXcubemapIncompleteInvalidBitSet,&local_19);
    }
    bVar2 = local_19 & 0x3f;
    if (bVar2 == 0) {
      local_18 = 0;
    }
    else {
      local_18 = 0;
      bVar3 = local_19 & 0x3f;
      do {
        local_18 = local_18 + (bVar3 & 1);
        bVar1 = 1 < bVar3;
        bVar3 = bVar3 >> 1;
      } while (bVar1);
    }
    local_19 = bVar2;
    if (local_18 == 6) {
      warning<>(this,&Metadata::KTXcubemapIncompleteAllBitsSet);
    }
    if (local_18 == 0) {
      error<>(this,&Metadata::KTXcubemapIncompleteNoBitSet);
    }
    if ((local_18 != 0) && ((this->header).layerCount % local_18 != 0)) {
      error<unsigned_int&,int_const&>
                (this,&Metadata::KTXcubemapIncompleteIncompatibleLayerCount,
                 &(this->header).layerCount,(int *)&local_18);
    }
    if ((this->header).faceCount != 1) {
      error<unsigned_int&>
                (this,&Metadata::KTXcubemapIncompleteWithFaceCountNot1,&(this->header).faceCount);
    }
    if ((this->header).pixelHeight != (this->header).pixelWidth) {
      error<unsigned_int&,unsigned_int&>
                (this,&HeaderData::CubeHeightWidthMismatch,&(this->header).pixelWidth,
                 &(this->header).pixelHeight);
    }
    if ((this->header).pixelDepth != 0) {
      error<unsigned_int&>(this,&HeaderData::CubeWithDepth,&(this->header).pixelDepth);
    }
  }
  return;
}

Assistant:

void ValidationContext::validateKTXcubemapIncomplete(const uint8_t* data, uint32_t size) {
    foundKTXcubemapIncomplete = true;

    if (size != 1)
        error(Metadata::KTXcubemapIncompleteInvalidSize, size);

    if (size == 0)
        return;

    uint8_t value = *data;

    if (size > 0 && (value & 0b11000000u) != 0)
        error(Metadata::KTXcubemapIncompleteInvalidBitSet, value);
    value = value & 0b00111111u; // Error recovery

    const auto popCount = popcount(value);
    if (popCount == 6)
        warning(Metadata::KTXcubemapIncompleteAllBitsSet);

    if (popCount == 0)
        error(Metadata::KTXcubemapIncompleteNoBitSet);

    if (popCount != 0 && (header.layerCount % popCount != 0))
        error(Metadata::KTXcubemapIncompleteIncompatibleLayerCount, header.layerCount, popCount);

    if (header.faceCount != 1)
        error(Metadata::KTXcubemapIncompleteWithFaceCountNot1, header.faceCount);

    if (header.pixelHeight != header.pixelWidth)
        error(HeaderData::CubeHeightWidthMismatch, header.pixelWidth, header.pixelHeight);

    if (header.pixelDepth != 0)
        error(HeaderData::CubeWithDepth, header.pixelDepth);
}